

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void InitializeMinimumPhaseAnalysis(int fft_size,MinimumPhaseAnalysis *minimum_phase)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  double *pdVar5;
  fft_complex *padVar6;
  fft_plan local_a8;
  fft_plan local_60;
  MinimumPhaseAnalysis *local_18;
  MinimumPhaseAnalysis *minimum_phase_local;
  int fft_size_local;
  
  minimum_phase->fft_size = fft_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)fft_size;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_18 = minimum_phase;
  minimum_phase_local._4_4_ = fft_size;
  pdVar5 = (double *)operator_new__(uVar4);
  local_18->log_spectrum = pdVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)minimum_phase_local._4_4_;
  uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  padVar6 = (fft_complex *)operator_new__(uVar4);
  local_18->minimum_phase_spectrum = padVar6;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)minimum_phase_local._4_4_;
  uVar4 = SUB168(auVar3 * ZEXT816(0x10),0);
  if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  padVar6 = (fft_complex *)operator_new__(uVar4);
  local_18->cepstrum = padVar6;
  fft_plan_dft_r2c_1d(&local_60,minimum_phase_local._4_4_,local_18->log_spectrum,local_18->cepstrum,
                      3);
  memcpy(&local_18->inverse_fft,&local_60,0x48);
  fft_plan_dft_1d(&local_a8,minimum_phase_local._4_4_,local_18->cepstrum,
                  local_18->minimum_phase_spectrum,1,3);
  memcpy(&local_18->forward_fft,&local_a8,0x48);
  return;
}

Assistant:

void InitializeMinimumPhaseAnalysis(int fft_size,
    MinimumPhaseAnalysis *minimum_phase) {
  minimum_phase->fft_size = fft_size;
  minimum_phase->log_spectrum = new double[fft_size];
  minimum_phase->minimum_phase_spectrum = new fft_complex[fft_size];
  minimum_phase->cepstrum = new fft_complex[fft_size];
  minimum_phase->inverse_fft = fft_plan_dft_r2c_1d(fft_size,
      minimum_phase->log_spectrum, minimum_phase->cepstrum, FFT_ESTIMATE);
  minimum_phase->forward_fft = fft_plan_dft_1d(fft_size,
      minimum_phase->cepstrum, minimum_phase->minimum_phase_spectrum,
      FFT_FORWARD, FFT_ESTIMATE);
}